

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::localeDisplayName
          (LocaleDisplayNamesImpl *this,Locale *loc,UnicodeString *result)

{
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  ushort uVar4;
  int iVar5;
  int32_t iVar6;
  StringEnumeration *pSVar7;
  undefined4 extraout_var;
  UnicodeString *this_00;
  undefined4 uVar9;
  undefined4 uVar10;
  Locale *this_01;
  char cVar11;
  uint uVar12;
  UnicodeString *pUVar13;
  uint buflen;
  undefined7 uVar14;
  char *buffer_00;
  int32_t iVar15;
  char cVar16;
  bool bVar17;
  UErrorCode status;
  UnicodeString *local_268;
  UnicodeString *local_260;
  UnicodeString *local_258;
  UnicodeString *local_250;
  ICUDataTable *local_248;
  Locale *local_240;
  SimpleFormatter *local_238;
  UnicodeString *local_230;
  UObject local_228;
  UnicodeString temp;
  UnicodeString resultRemainder;
  UnicodeString temp3;
  UnicodeString resultName;
  UnicodeString temp2;
  char buffer [157];
  char *pcVar8;
  
  if (loc->fIsBogus != '\0') {
    UnicodeString::setToBogus(result);
    return result;
  }
  local_228._vptr_UObject = (_func_int **)&PTR__UnicodeString_003bc258;
  resultName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003bc258;
  resultName.fUnion.fStackFields.fLengthAndFlags = 2;
  pcVar8 = "root";
  if (loc->language[0] != '\0') {
    pcVar8 = loc->language;
  }
  local_260 = (UnicodeString *)loc->script;
  local_248 = (ICUDataTable *)loc->country;
  local_238 = (SimpleFormatter *)loc->baseName;
  iVar5 = loc->variantBegin;
  cVar11 = loc->script[0];
  cVar16 = loc->country[0];
  uVar14 = (undefined7)((ulong)loc >> 8);
  uVar12 = (uint)CONCAT71(uVar14,cVar11 != '\0');
  local_268 = (UnicodeString *)CONCAT44(local_268._4_4_,uVar12);
  buflen = (uint)CONCAT71(uVar14,cVar16 != '\0');
  local_258 = (UnicodeString *)CONCAT44(local_258._4_4_,buflen);
  local_250 = (UnicodeString *)CONCAT71(local_250._1_7_,(&local_238->field_0x0)[iVar5]);
  local_240 = loc;
  local_230 = result;
  if (this->dialectHandling == ULDN_DIALECT_NAMES) {
    if (cVar11 == '\0' || cVar16 == '\0') {
      if (cVar11 != '\0') goto LAB_00289404;
      if (cVar16 == '\0') {
        buflen = 0;
        uVar12 = 0;
        goto LAB_002894db;
      }
LAB_00289473:
      ncat(buffer,buflen,pcVar8,"_",local_248,0);
      localeIdName(this,buffer,&resultName);
      buflen = (uint)local_258 & 0xff;
      if ((resultName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        buflen = (ushort)resultName.fUnion.fStackFields.fLengthAndFlags & 1;
      }
      uVar12 = (uint)local_268;
    }
    else {
      buffer_00 = buffer;
      ncat(buffer_00,buflen,pcVar8,"_",local_260,"_",local_248,0);
      localeIdName(this,buffer_00,&resultName);
      buflen = (uint)buffer_00;
      if ((resultName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        buflen = 0;
        uVar12 = 0;
      }
      else {
LAB_00289404:
        ncat(buffer,buflen,pcVar8,"_",local_260,0);
        localeIdName(this,buffer,&resultName);
        uVar12 = 0;
        if ((resultName.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
          uVar12 = (uint)local_268 & 0xff;
        }
        buflen = (uint)local_268;
        if (((byte)resultName.fUnion.fStackFields.fLengthAndFlags & 1 & cVar16 != '\0') != 0)
        goto LAB_00289473;
        buflen = (uint)local_258;
      }
    }
    cVar16 = (char)buflen;
    cVar11 = (char)uVar12;
    this_01 = local_240;
    if (0x1f < (ushort)resultName.fUnion.fStackFields.fLengthAndFlags &&
        (resultName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) goto LAB_002894ee;
  }
LAB_002894db:
  this_01 = local_240;
  cVar16 = (char)buflen;
  cVar11 = (char)uVar12;
  localeIdName(this,pcVar8,&resultName);
LAB_002894ee:
  resultRemainder.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)(UObject)local_228._vptr_UObject;
  resultRemainder.fUnion.fStackFields.fLengthAndFlags = 2;
  temp.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_228._vptr_UObject;
  temp.fUnion.fStackFields.fLengthAndFlags = 2;
  status = U_ZERO_ERROR;
  if (cVar11 != '\0') {
    scriptDisplayName(this,(char *)local_260,&temp,'\x01');
    uVar9 = temp.fUnion.fFields.fLength;
    if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
      uVar9 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(&resultRemainder,&temp,0,uVar9);
  }
  if (cVar16 != '\0') {
    regionDisplayName(this,(char *)local_248,&temp,'\x01');
    appendWithSep(this,&resultRemainder,&temp);
  }
  if ((char)local_250 != '\0') {
    ICUDataTable::get(&this->langData,"Variants",(char *)0x0,&local_238->field_0x0 + iVar5,&temp);
    appendWithSep(this,&resultRemainder,&temp);
  }
  uVar9 = resultRemainder.fUnion.fFields.fLength;
  if (-1 < resultRemainder.fUnion.fStackFields.fLengthAndFlags) {
    uVar9 = (int)resultRemainder.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  sVar1 = (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar15 = (this->formatOpenParen).fUnion.fFields.fLength;
  }
  else {
    iVar15 = (int)sVar1 >> 5;
  }
  pUVar13 = &this->formatOpenParen;
  local_260 = &this->formatReplaceOpenParen;
  sVar1 = (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (this->formatReplaceOpenParen).fUnion.fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  UnicodeString::findAndReplace(&resultRemainder,0,uVar9,pUVar13,0,iVar15,local_260,0,iVar6);
  if (-1 < resultRemainder.fUnion.fStackFields.fLengthAndFlags) {
    resultRemainder.fUnion.fFields.fLength =
         (int)resultRemainder.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  sVar1 = (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar15 = (this->formatCloseParen).fUnion.fFields.fLength;
  }
  else {
    iVar15 = (int)sVar1 >> 5;
  }
  local_250 = &this->formatCloseParen;
  local_268 = &this->formatReplaceCloseParen;
  sVar1 = (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (this->formatReplaceCloseParen).fUnion.fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  UnicodeString::findAndReplace
            (&resultRemainder,0,resultRemainder.fUnion.fFields.fLength,local_250,0,iVar15,local_268,
             0,iVar6);
  pSVar7 = Locale::createKeywords(this_01,&status);
  if ((pSVar7 != (StringEnumeration *)0x0) && (status < U_ILLEGAL_ARGUMENT_ERROR)) {
    temp2.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_228._vptr_UObject;
    temp2.fUnion.fStackFields.fLengthAndFlags = 2;
    local_248 = &this->langData;
    local_238 = &this->keyTypeFormat;
    local_258 = pUVar13;
    while( true ) {
      iVar5 = (*(pSVar7->super_UObject)._vptr_UObject[5])(pSVar7,0,&status);
      pcVar8 = (char *)CONCAT44(extraout_var,iVar5);
      if (pcVar8 == (char *)0x0) break;
      buffer[0] = '\0';
      Locale::getKeywordValue(local_240,pcVar8,buffer,100,&status);
      if ((U_ZERO_ERROR < status) || (status == U_STRING_NOT_TERMINATED_WARNING)) {
        UnicodeString::~UnicodeString(&temp2);
        goto LAB_00289bf1;
      }
      ICUDataTable::get(local_248,"Keys",(char *)0x0,pcVar8,&temp);
      uVar9 = temp.fUnion.fFields.fLength;
      if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
        uVar9 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar1 = (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar15 = (this->formatOpenParen).fUnion.fFields.fLength;
      }
      else {
        iVar15 = (int)sVar1 >> 5;
      }
      sVar1 = (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this->formatReplaceOpenParen).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      UnicodeString::findAndReplace(&temp,0,uVar9,pUVar13,0,iVar15,local_260,0,iVar6);
      uVar9 = temp.fUnion.fFields.fLength;
      if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
        uVar9 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar1 = (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar15 = (this->formatCloseParen).fUnion.fFields.fLength;
      }
      else {
        iVar15 = (int)sVar1 >> 5;
      }
      sVar1 = (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this->formatReplaceCloseParen).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      UnicodeString::findAndReplace(&temp,0,uVar9,local_250,0,iVar15,local_268,0,iVar6);
      keyValueDisplayName(this,pcVar8,buffer,&temp2,'\x01');
      uVar9 = temp2.fUnion.fFields.fLength;
      if (-1 < temp2.fUnion.fStackFields.fLengthAndFlags) {
        uVar9 = (int)temp2.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar1 = (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar15 = (this->formatOpenParen).fUnion.fFields.fLength;
      }
      else {
        iVar15 = (int)sVar1 >> 5;
      }
      sVar1 = (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this->formatReplaceOpenParen).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      UnicodeString::findAndReplace(&temp2,0,uVar9,pUVar13,0,iVar15,local_260,0,iVar6);
      uVar9 = temp2.fUnion.fFields.fLength;
      if (-1 < temp2.fUnion.fStackFields.fLengthAndFlags) {
        uVar9 = (int)temp2.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar1 = (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar15 = (this->formatCloseParen).fUnion.fFields.fLength;
      }
      else {
        iVar15 = (int)sVar1 >> 5;
      }
      sVar1 = (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this->formatReplaceCloseParen).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      UnicodeString::findAndReplace(&temp2,0,uVar9,local_250,0,iVar15,local_268,0,iVar6);
      UnicodeString::UnicodeString(&temp3,buffer,-1,kInvariant);
      if ((temp2.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        uVar9 = temp2.fUnion.fFields.fLength;
        if (-1 < temp2.fUnion.fStackFields.fLengthAndFlags) {
          uVar9 = (int)temp2.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        uVar10 = temp3.fUnion.fFields.fLength;
        if (-1 < temp3.fUnion.fStackFields.fLengthAndFlags) {
          uVar10 = (int)temp3.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if ((((int)temp3.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) && (uVar9 == uVar10)) {
          UVar3 = UnicodeString::doEquals(&temp2,&temp3,uVar9);
          bVar17 = UVar3 != '\0';
          goto LAB_002899f3;
        }
        UnicodeString::~UnicodeString(&temp3);
LAB_00289a33:
        appendWithSep(this,&resultRemainder,&temp2);
      }
      else {
        bVar17 = (bool)(temp3.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
LAB_002899f3:
        UnicodeString::~UnicodeString(&temp3);
        pUVar13 = local_258;
        if (bVar17 == false) goto LAB_00289a33;
        UnicodeString::UnicodeString(&temp3,pcVar8,-1,kInvariant);
        if ((temp.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          uVar9 = temp.fUnion.fFields.fLength;
          if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
            uVar9 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          uVar10 = temp3.fUnion.fFields.fLength;
          if (-1 < temp3.fUnion.fStackFields.fLengthAndFlags) {
            uVar10 = (int)temp3.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if ((((int)temp3.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) && (uVar9 == uVar10)) {
            UVar3 = UnicodeString::doEquals(&temp,&temp3,uVar9);
            bVar17 = UVar3 != '\0';
            goto LAB_00289a95;
          }
          UnicodeString::~UnicodeString(&temp3);
LAB_00289afb:
          temp3.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)(UObject)local_228._vptr_UObject;
          temp3.fUnion.fStackFields.fLengthAndFlags = 2;
          SimpleFormatter::format(local_238,&temp,&temp2,&temp3,&status);
          appendWithSep(this,&resultRemainder,&temp3);
          UnicodeString::~UnicodeString(&temp3);
        }
        else {
          bVar17 = (bool)(temp3.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
LAB_00289a95:
          UnicodeString::~UnicodeString(&temp3);
          pUVar13 = local_258;
          if (bVar17 == false) goto LAB_00289afb;
          appendWithSep(this,&resultRemainder,&temp);
          temp3.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x3d;
          this_00 = UnicodeString::doAppend(&resultRemainder,(UChar *)&temp3,0,1);
          uVar9 = temp2.fUnion.fFields.fLength;
          if (-1 < temp2.fUnion.fStackFields.fLengthAndFlags) {
            uVar9 = (int)temp2.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          UnicodeString::doAppend(this_00,&temp2,0,uVar9);
        }
      }
    }
    UnicodeString::~UnicodeString(&temp2);
  }
  pUVar13 = local_230;
  if ((ushort)resultRemainder.fUnion.fStackFields.fLengthAndFlags < 0x20) {
    UnicodeString::operator=(local_230,&resultName);
  }
  else {
    uVar2 = (local_230->fUnion).fStackFields.fLengthAndFlags;
    uVar4 = 2;
    if ((uVar2 & 1) == 0) {
      uVar4 = uVar2 & 0x1e;
    }
    (local_230->fUnion).fStackFields.fLengthAndFlags = uVar4;
    SimpleFormatter::format(&this->format,&resultName,&resultRemainder,local_230,&status);
  }
  adjustForUsageAndContext(this,kCapContextUsageLanguage,pUVar13);
  if (pSVar7 != (StringEnumeration *)0x0) {
LAB_00289bf1:
    (*(pSVar7->super_UObject)._vptr_UObject[1])(pSVar7);
  }
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::~UnicodeString(&resultRemainder);
  UnicodeString::~UnicodeString(&resultName);
  return local_230;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::localeDisplayName(const Locale& loc,
                                          UnicodeString& result) const {
  if (loc.isBogus()) {
    result.setToBogus();
    return result;
  }
  UnicodeString resultName;

  const char* lang = loc.getLanguage();
  if (uprv_strlen(lang) == 0) {
    lang = "root";
  }
  const char* script = loc.getScript();
  const char* country = loc.getCountry();
  const char* variant = loc.getVariant();

  UBool hasScript = uprv_strlen(script) > 0;
  UBool hasCountry = uprv_strlen(country) > 0;
  UBool hasVariant = uprv_strlen(variant) > 0;

  if (dialectHandling == ULDN_DIALECT_NAMES) {
    char buffer[ULOC_FULLNAME_CAPACITY];
    do { // loop construct is so we can break early out of search
      if (hasScript && hasCountry) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", script, "_", country, (char *)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasScript = FALSE;
          hasCountry = FALSE;
          break;
        }
      }
      if (hasScript) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", script, (char *)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasScript = FALSE;
          break;
        }
      }
      if (hasCountry) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", country, (char*)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasCountry = FALSE;
          break;
        }
      }
    } while (FALSE);
  }
  if (resultName.isBogus() || resultName.isEmpty()) {
    localeIdName(lang, resultName);
  }

  UnicodeString resultRemainder;
  UnicodeString temp;
  UErrorCode status = U_ZERO_ERROR;

  if (hasScript) {
    resultRemainder.append(scriptDisplayName(script, temp, TRUE));
  }
  if (hasCountry) {
    appendWithSep(resultRemainder, regionDisplayName(country, temp, TRUE));
  }
  if (hasVariant) {
    appendWithSep(resultRemainder, variantDisplayName(variant, temp, TRUE));
  }
  resultRemainder.findAndReplace(formatOpenParen, formatReplaceOpenParen);
  resultRemainder.findAndReplace(formatCloseParen, formatReplaceCloseParen);

  LocalPointer<StringEnumeration> e(loc.createKeywords(status));
  if (e.isValid() && U_SUCCESS(status)) {
    UnicodeString temp2;
    char value[ULOC_KEYWORD_AND_VALUES_CAPACITY]; // sigh, no ULOC_VALUE_CAPACITY
    const char* key;
    while ((key = e->next((int32_t *)0, status)) != NULL) {
      value[0] = 0;
      loc.getKeywordValue(key, value, ULOC_KEYWORD_AND_VALUES_CAPACITY, status);
      if (U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING) {
        return result;
      }
      keyDisplayName(key, temp, TRUE);
      temp.findAndReplace(formatOpenParen, formatReplaceOpenParen);
      temp.findAndReplace(formatCloseParen, formatReplaceCloseParen);
      keyValueDisplayName(key, value, temp2, TRUE);
      temp2.findAndReplace(formatOpenParen, formatReplaceOpenParen);
      temp2.findAndReplace(formatCloseParen, formatReplaceCloseParen);
      if (temp2 != UnicodeString(value, -1, US_INV)) {
        appendWithSep(resultRemainder, temp2);
      } else if (temp != UnicodeString(key, -1, US_INV)) {
        UnicodeString temp3;
        keyTypeFormat.format(temp, temp2, temp3, status);
        appendWithSep(resultRemainder, temp3);
      } else {
        appendWithSep(resultRemainder, temp)
          .append((UChar)0x3d /* = */)
          .append(temp2);
      }
    }
  }

  if (!resultRemainder.isEmpty()) {
    format.format(resultName, resultRemainder, result.remove(), status);
    return adjustForUsageAndContext(kCapContextUsageLanguage, result);
  }

  result = resultName;
  return adjustForUsageAndContext(kCapContextUsageLanguage, result);
}